

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::set_ssl_cert_buffer
          (torrent *this,string *certificate,string *private_key,string *dh_params)

{
  bool bVar1;
  void *pvVar2;
  size_t sVar3;
  pointer pcVar4;
  alert_manager *paVar5;
  undefined1 local_a8 [24];
  const_buffer dh_params_buf;
  undefined1 local_78 [8];
  const_buffer private_key_buf;
  undefined1 local_58 [24];
  error_code ec;
  const_buffer certificate_buf;
  string *dh_params_local;
  string *private_key_local;
  string *certificate_local;
  torrent *this_local;
  
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_ssl_ctx);
  if (bVar1) {
    pvVar2 = (void *)::std::__cxx11::string::c_str();
    sVar3 = ::std::__cxx11::string::size();
    boost::asio::const_buffer::const_buffer((const_buffer *)&ec.cat_,pvVar2,sVar3);
    boost::system::error_code::error_code((error_code *)(local_58 + 0x10));
    pcVar4 = ::std::
             unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
             ::operator->(&this->m_ssl_ctx);
    boost::asio::ssl::context::use_certificate
              (pcVar4,(const_buffer *)&ec.cat_,pem,(error_code *)(local_58 + 0x10));
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)(local_58 + 0x10));
    if (bVar1) {
      paVar5 = alerts(this);
      bVar1 = alert_manager::should_post<libtorrent::torrent_error_alert>(paVar5);
      if (bVar1) {
        paVar5 = alerts(this);
        get_handle((torrent *)local_58);
        alert_manager::
        emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,char_const(&)[14]>
                  (paVar5,(torrent_handle *)local_58,(error_code *)(local_58 + 0x10),
                   (char (*) [14])"[certificate]");
        torrent_handle::~torrent_handle((torrent_handle *)local_58);
      }
    }
    pvVar2 = (void *)::std::__cxx11::string::c_str();
    sVar3 = ::std::__cxx11::string::size();
    boost::asio::const_buffer::const_buffer((const_buffer *)local_78,pvVar2,sVar3);
    pcVar4 = ::std::
             unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
             ::operator->(&this->m_ssl_ctx);
    boost::asio::ssl::context::use_private_key
              (pcVar4,(const_buffer *)local_78,pem,(error_code *)(local_58 + 0x10));
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)(local_58 + 0x10));
    if (bVar1) {
      paVar5 = alerts(this);
      bVar1 = alert_manager::should_post<libtorrent::torrent_error_alert>(paVar5);
      if (bVar1) {
        paVar5 = alerts(this);
        get_handle((torrent *)&dh_params_buf.size_);
        alert_manager::
        emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,char_const(&)[14]>
                  (paVar5,(torrent_handle *)&dh_params_buf.size_,(error_code *)(local_58 + 0x10),
                   (char (*) [14])"[private key]");
        torrent_handle::~torrent_handle((torrent_handle *)&dh_params_buf.size_);
      }
    }
    pvVar2 = (void *)::std::__cxx11::string::c_str();
    sVar3 = ::std::__cxx11::string::size();
    boost::asio::const_buffer::const_buffer((const_buffer *)(local_a8 + 0x10),pvVar2,sVar3);
    pcVar4 = ::std::
             unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
             ::operator->(&this->m_ssl_ctx);
    boost::asio::ssl::context::use_tmp_dh
              (pcVar4,(const_buffer *)(local_a8 + 0x10),(error_code *)(local_58 + 0x10));
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)(local_58 + 0x10));
    if (bVar1) {
      paVar5 = alerts(this);
      bVar1 = alert_manager::should_post<libtorrent::torrent_error_alert>(paVar5);
      if (bVar1) {
        paVar5 = alerts(this);
        get_handle((torrent *)local_a8);
        alert_manager::
        emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,char_const(&)[12]>
                  (paVar5,(torrent_handle *)local_a8,(error_code *)(local_58 + 0x10),
                   (char (*) [12])"[dh params]");
        torrent_handle::~torrent_handle((torrent_handle *)local_a8);
      }
    }
  }
  return;
}

Assistant:

void torrent::set_ssl_cert_buffer(std::string const& certificate
		, std::string const& private_key
		, std::string const& dh_params)
	{
		if (!m_ssl_ctx) return;

		boost::asio::const_buffer certificate_buf(certificate.c_str(), certificate.size());

		error_code ec;
		m_ssl_ctx->use_certificate(certificate_buf, ssl::context::pem, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, "[certificate]");
		}

		boost::asio::const_buffer private_key_buf(private_key.c_str(), private_key.size());
		m_ssl_ctx->use_private_key(private_key_buf, ssl::context::pem, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, "[private key]");
		}

		boost::asio::const_buffer dh_params_buf(dh_params.c_str(), dh_params.size());
		m_ssl_ctx->use_tmp_dh(dh_params_buf, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, "[dh params]");
		}
	}